

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O1

double __thiscall MeshDenoisingBase::getAverageEdgeLength(MeshDenoisingBase *this,TriMesh *mesh)

{
  undefined8 uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  EdgeIter EVar4;
  Normal local_58;
  double local_40;
  undefined1 local_38 [8];
  EdgeIter e_it;
  
  _local_38 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  EVar4 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
  e_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  e_it.skip_bits_ = 0;
  if ((BaseHandle)e_it.mesh_._0_4_ != (BaseHandle)EVar4.hnd_.super_BaseHandle.idx_ ||
      local_38 != (undefined1  [8])EVar4.mesh_) {
    e_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
    e_it.skip_bits_ = 0;
    do {
      OpenMesh::
      PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      ::calc_edge_vector(&local_58,
                         (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          *)mesh,(HalfedgeHandle)(e_it.mesh_._0_4_ * 2));
      dVar2 = local_58.super_VectorDataT<double,_3>.values_[2] *
              local_58.super_VectorDataT<double,_3>.values_[2] +
              local_58.super_VectorDataT<double,_3>.values_[0] *
              local_58.super_VectorDataT<double,_3>.values_[0] +
              local_58.super_VectorDataT<double,_3>.values_[1] *
              local_58.super_VectorDataT<double,_3>.values_[1];
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      e_it.mesh_._0_4_ = e_it.mesh_._0_4_ + 1;
      if (e_it.mesh_._4_4_ != 0) {
        local_40 = dVar2;
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_38);
        dVar2 = local_40;
      }
      e_it._8_8_ = (double)e_it._8_8_ + dVar2;
      EVar4 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
    } while ((BaseHandle)e_it.mesh_._0_4_ != (BaseHandle)EVar4.hnd_.super_BaseHandle.idx_ ||
             local_38 != (undefined1  [8])EVar4.mesh_);
  }
  uVar1 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x20))(mesh);
  auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._12_4_ = 0x45300000;
  return (double)e_it._8_8_ /
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
}

Assistant:

double MeshDenoisingBase::getAverageEdgeLength(TriMesh &mesh)
{
    double average_edge_length = 0.0;
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
        average_edge_length += mesh.calc_edge_length(*e_it);
    double edgeNum = (double)mesh.n_edges();
    average_edge_length /= edgeNum;

    return average_edge_length;
}